

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetContentRegionMax(void)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiContext_conflict *pIVar2;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  ImVec2 mx;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  g = (ImGuiContext_conflict *)operator-(&(pIVar1->ContentRegionRect).Max,&pIVar1->Pos);
  if (((pIVar1->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
     (pIVar2->CurrentTable != (ImGuiTable *)0x0)) {
    g = (ImGuiContext_conflict *)CONCAT44(SUB84(g,4),(pIVar1->WorkRect).Max.x - (pIVar1->Pos).x);
  }
  return (ImVec2)g;
}

Assistant:

ImVec2 ImGui::GetContentRegionMax()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max - window->Pos;
    if (window->DC.CurrentColumns || g.CurrentTable)
        mx.x = window->WorkRect.Max.x - window->Pos.x;
    return mx;
}